

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  Scene *pSVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  ulong uVar31;
  undefined1 auVar32 [16];
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  AABBNodeMB4D *node1;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  undefined4 uVar43;
  ulong unaff_RBX;
  size_t mask;
  NodeRef *pNVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  size_t sVar48;
  uint uVar49;
  ulong uVar50;
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 *local_aa8;
  ulong local_aa0;
  ulong local_a98;
  NodeRef *local_a90;
  ulong local_a88;
  ulong local_a80;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar98._4_4_ = uVar1;
  auVar98._0_4_ = uVar1;
  auVar98._8_4_ = uVar1;
  auVar98._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar27 = fVar3 * 0.99999964;
  fVar28 = fVar4 * 0.99999964;
  fVar29 = fVar5 * 0.99999964;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar50 = uVar45 ^ 0x10;
  local_a80 = uVar46 ^ 0x10;
  local_a88 = uVar42 ^ 0x10;
  iVar6 = (tray->tnear).field_0.i[k];
  iVar7 = (tray->tfar).field_0.i[k];
  auVar53._4_4_ = iVar7;
  auVar53._0_4_ = iVar7;
  auVar53._8_4_ = iVar7;
  auVar53._12_4_ = iVar7;
  local_aa8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  pNVar44 = stack + 1;
  do {
    local_a90 = pNVar44;
    if (local_a90 == stack) break;
    pNVar44 = local_a90 + -1;
    sVar48 = local_a90[-1].ptr;
    do {
      if ((sVar48 & 8) == 0) {
        uVar39 = sVar48 & 0xfffffffffffffff0;
        uVar43 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar54._4_4_ = uVar43;
        auVar54._0_4_ = uVar43;
        auVar54._8_4_ = uVar43;
        auVar54._12_4_ = uVar43;
        auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar45),auVar54,
                                  *(undefined1 (*) [16])(uVar39 + 0x20 + uVar45));
        auVar55 = vsubps_avx(auVar55,auVar98);
        auVar60._0_4_ = auVar55._0_4_ * fVar27;
        auVar60._4_4_ = auVar55._4_4_ * fVar27;
        auVar60._8_4_ = auVar55._8_4_ * fVar27;
        auVar60._12_4_ = auVar55._12_4_ * fVar27;
        auVar55._4_4_ = iVar6;
        auVar55._0_4_ = iVar6;
        auVar55._8_4_ = iVar6;
        auVar55._12_4_ = iVar6;
        auVar55 = vmaxps_avx(auVar55,auVar60);
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar46),auVar54,
                                  *(undefined1 (*) [16])(uVar39 + 0x20 + uVar46));
        auVar32._4_4_ = uVar1;
        auVar32._0_4_ = uVar1;
        auVar32._8_4_ = uVar1;
        auVar32._12_4_ = uVar1;
        auVar60 = vsubps_avx(auVar60,auVar32);
        auVar64._0_4_ = auVar60._0_4_ * fVar28;
        auVar64._4_4_ = auVar60._4_4_ * fVar28;
        auVar64._8_4_ = auVar60._8_4_ * fVar28;
        auVar64._12_4_ = auVar60._12_4_ * fVar28;
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar42),auVar54,
                                  *(undefined1 (*) [16])(uVar39 + 0x20 + uVar42));
        auVar30._4_4_ = uVar2;
        auVar30._0_4_ = uVar2;
        auVar30._8_4_ = uVar2;
        auVar30._12_4_ = uVar2;
        auVar60 = vsubps_avx(auVar60,auVar30);
        auVar73._0_4_ = auVar60._0_4_ * fVar29;
        auVar73._4_4_ = auVar60._4_4_ * fVar29;
        auVar73._8_4_ = auVar60._8_4_ * fVar29;
        auVar73._12_4_ = auVar60._12_4_ * fVar29;
        auVar60 = vmaxps_avx(auVar64,auVar73);
        auVar55 = vmaxps_avx(auVar55,auVar60);
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar50),auVar54,
                                  *(undefined1 (*) [16])(uVar39 + 0x20 + uVar50));
        auVar60 = vsubps_avx(auVar60,auVar98);
        auVar65._0_4_ = auVar60._0_4_ * fVar3;
        auVar65._4_4_ = auVar60._4_4_ * fVar3;
        auVar65._8_4_ = auVar60._8_4_ * fVar3;
        auVar65._12_4_ = auVar60._12_4_ * fVar3;
        auVar60 = vminps_avx(auVar53,auVar65);
        auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + local_a80),auVar54,
                                  *(undefined1 (*) [16])(uVar39 + 0x20 + local_a80));
        auVar64 = vsubps_avx(auVar64,auVar32);
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + local_a88),auVar54,
                                  *(undefined1 (*) [16])(uVar39 + 0x20 + local_a88));
        auVar74._0_4_ = auVar64._0_4_ * fVar4;
        auVar74._4_4_ = auVar64._4_4_ * fVar4;
        auVar74._8_4_ = auVar64._8_4_ * fVar4;
        auVar74._12_4_ = auVar64._12_4_ * fVar4;
        auVar64 = vsubps_avx(auVar32,auVar30);
        auVar79._0_4_ = auVar64._0_4_ * fVar5;
        auVar79._4_4_ = auVar64._4_4_ * fVar5;
        auVar79._8_4_ = auVar64._8_4_ * fVar5;
        auVar79._12_4_ = auVar64._12_4_ * fVar5;
        auVar64 = vminps_avx(auVar74,auVar79);
        auVar60 = vminps_avx(auVar60,auVar64);
        if (((uint)sVar48 & 7) == 6) {
          auVar60 = vcmpps_avx(auVar55,auVar60,2);
          auVar55 = vcmpps_avx(*(undefined1 (*) [16])(uVar39 + 0xe0),auVar54,2);
          auVar64 = vcmpps_avx(auVar54,*(undefined1 (*) [16])(uVar39 + 0xf0),1);
          auVar55 = vandps_avx(auVar55,auVar64);
          auVar55 = vandps_avx(auVar55,auVar60);
        }
        else {
          auVar55 = vcmpps_avx(auVar55,auVar60,2);
        }
        auVar55 = vpslld_avx(auVar55,0x1f);
        uVar43 = vmovmskps_avx(auVar55);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar43);
      }
      if ((sVar48 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar49 = 4;
        }
        else {
          uVar47 = sVar48 & 0xfffffffffffffff0;
          lVar40 = 0;
          for (uVar39 = unaff_RBX; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
            lVar40 = lVar40 + 1;
          }
          uVar49 = 0;
          for (uVar39 = unaff_RBX - 1 & unaff_RBX; sVar48 = *(size_t *)(uVar47 + lVar40 * 8),
              uVar39 != 0; uVar39 = uVar39 - 1 & uVar39) {
            pNVar44->ptr = sVar48;
            pNVar44 = pNVar44 + 1;
            lVar40 = 0;
            for (uVar31 = uVar39; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar40 = lVar40 + 1;
            }
          }
        }
      }
      else {
        uVar49 = 6;
      }
    } while (uVar49 == 0);
    if (uVar49 == 6) {
      uVar49 = 0;
      local_aa0 = (ulong)((uint)sVar48 & 0xf) - 8;
      bVar51 = local_aa0 != 0;
      if (bVar51) {
        uVar47 = sVar48 & 0xfffffffffffffff0;
        local_a98 = 0;
        uVar39 = uVar50;
        do {
          lVar40 = local_a98 * 0x140;
          uVar43 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar80._4_4_ = uVar43;
          auVar80._0_4_ = uVar43;
          auVar80._8_4_ = uVar43;
          auVar80._12_4_ = uVar43;
          auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar47 + 0x90 + lVar40),auVar80,
                                    *(undefined1 (*) [16])(uVar47 + lVar40));
          auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar47 + 0xa0 + lVar40),auVar80,
                                    *(undefined1 (*) [16])(uVar47 + 0x10 + lVar40));
          auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar47 + 0xb0 + lVar40),auVar80,
                                    *(undefined1 (*) [16])(uVar47 + 0x20 + lVar40));
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar47 + 0xc0 + lVar40),auVar80,
                                    *(undefined1 (*) [16])(uVar47 + 0x30 + lVar40));
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar47 + 0xd0 + lVar40),auVar80,
                                    *(undefined1 (*) [16])(uVar47 + 0x40 + lVar40));
          auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar47 + 0xe0 + lVar40),auVar80,
                                    *(undefined1 (*) [16])(uVar47 + 0x50 + lVar40));
          auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar47 + 0xf0 + lVar40),auVar80,
                                    *(undefined1 (*) [16])(uVar47 + 0x60 + lVar40));
          auVar79 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar47 + 0x100 + lVar40),auVar80,
                                    *(undefined1 (*) [16])(uVar47 + 0x70 + lVar40));
          auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar47 + 0x110 + lVar40),auVar80,
                                    *(undefined1 (*) [16])(uVar47 + 0x80 + lVar40));
          uVar43 = *(undefined4 *)(ray + k * 4);
          auVar81._4_4_ = uVar43;
          auVar81._0_4_ = uVar43;
          auVar81._8_4_ = uVar43;
          auVar81._12_4_ = uVar43;
          uVar43 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar108._4_4_ = uVar43;
          auVar108._0_4_ = uVar43;
          auVar108._8_4_ = uVar43;
          auVar108._12_4_ = uVar43;
          uVar43 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar113._4_4_ = uVar43;
          auVar113._0_4_ = uVar43;
          auVar113._8_4_ = uVar43;
          auVar113._12_4_ = uVar43;
          auVar32 = vsubps_avx(auVar55,auVar81);
          auVar30 = vsubps_avx(auVar60,auVar108);
          auVar55 = vsubps_avx(auVar64,auVar113);
          auVar60 = vsubps_avx(auVar54,auVar81);
          auVar64 = vsubps_avx(auVar65,auVar108);
          auVar54 = vsubps_avx(auVar73,auVar113);
          auVar65 = vsubps_avx(auVar74,auVar81);
          auVar73 = vsubps_avx(auVar79,auVar108);
          auVar74 = vsubps_avx(auVar80,auVar113);
          auVar79 = vsubps_avx(auVar65,auVar32);
          auVar80 = vsubps_avx(auVar73,auVar30);
          auVar81 = vsubps_avx(auVar74,auVar55);
          auVar56._0_4_ = auVar65._0_4_ + auVar32._0_4_;
          auVar56._4_4_ = auVar65._4_4_ + auVar32._4_4_;
          auVar56._8_4_ = auVar65._8_4_ + auVar32._8_4_;
          auVar56._12_4_ = auVar65._12_4_ + auVar32._12_4_;
          auVar75._0_4_ = auVar73._0_4_ + auVar30._0_4_;
          auVar75._4_4_ = auVar73._4_4_ + auVar30._4_4_;
          auVar75._8_4_ = auVar73._8_4_ + auVar30._8_4_;
          auVar75._12_4_ = auVar73._12_4_ + auVar30._12_4_;
          fVar15 = auVar55._0_4_;
          auVar82._0_4_ = auVar74._0_4_ + fVar15;
          fVar16 = auVar55._4_4_;
          auVar82._4_4_ = auVar74._4_4_ + fVar16;
          fVar17 = auVar55._8_4_;
          auVar82._8_4_ = auVar74._8_4_ + fVar17;
          fVar18 = auVar55._12_4_;
          auVar82._12_4_ = auVar74._12_4_ + fVar18;
          auVar109._0_4_ = auVar75._0_4_ * auVar81._0_4_;
          auVar109._4_4_ = auVar75._4_4_ * auVar81._4_4_;
          auVar109._8_4_ = auVar75._8_4_ * auVar81._8_4_;
          auVar109._12_4_ = auVar75._12_4_ * auVar81._12_4_;
          auVar108 = vfmsub231ps_fma(auVar109,auVar80,auVar82);
          auVar83._0_4_ = auVar82._0_4_ * auVar79._0_4_;
          auVar83._4_4_ = auVar82._4_4_ * auVar79._4_4_;
          auVar83._8_4_ = auVar82._8_4_ * auVar79._8_4_;
          auVar83._12_4_ = auVar82._12_4_ * auVar79._12_4_;
          auVar82 = vfmsub231ps_fma(auVar83,auVar81,auVar56);
          auVar57._0_4_ = auVar80._0_4_ * auVar56._0_4_;
          auVar57._4_4_ = auVar80._4_4_ * auVar56._4_4_;
          auVar57._8_4_ = auVar80._8_4_ * auVar56._8_4_;
          auVar57._12_4_ = auVar80._12_4_ * auVar56._12_4_;
          auVar56 = vfmsub231ps_fma(auVar57,auVar79,auVar75);
          fVar8 = *(float *)(ray + k * 4 + 0x60);
          auVar103._0_4_ = fVar8 * auVar56._0_4_;
          auVar103._4_4_ = fVar8 * auVar56._4_4_;
          auVar103._8_4_ = fVar8 * auVar56._8_4_;
          auVar103._12_4_ = fVar8 * auVar56._12_4_;
          uVar43 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar106._4_4_ = uVar43;
          auVar106._0_4_ = uVar43;
          auVar106._8_4_ = uVar43;
          auVar106._12_4_ = uVar43;
          auVar82 = vfmadd231ps_fma(auVar103,auVar106,auVar82);
          uVar43 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar114._4_4_ = uVar43;
          auVar114._0_4_ = uVar43;
          auVar114._8_4_ = uVar43;
          auVar114._12_4_ = uVar43;
          auVar75 = vfmadd231ps_fma(auVar82,auVar114,auVar108);
          auVar82 = vsubps_avx(auVar30,auVar64);
          auVar108 = vsubps_avx(auVar55,auVar54);
          auVar76._0_4_ = auVar30._0_4_ + auVar64._0_4_;
          auVar76._4_4_ = auVar30._4_4_ + auVar64._4_4_;
          auVar76._8_4_ = auVar30._8_4_ + auVar64._8_4_;
          auVar76._12_4_ = auVar30._12_4_ + auVar64._12_4_;
          auVar84._0_4_ = fVar15 + auVar54._0_4_;
          auVar84._4_4_ = fVar16 + auVar54._4_4_;
          auVar84._8_4_ = fVar17 + auVar54._8_4_;
          auVar84._12_4_ = fVar18 + auVar54._12_4_;
          fVar19 = auVar108._0_4_;
          auVar92._0_4_ = auVar76._0_4_ * fVar19;
          fVar21 = auVar108._4_4_;
          auVar92._4_4_ = auVar76._4_4_ * fVar21;
          fVar23 = auVar108._8_4_;
          auVar92._8_4_ = auVar76._8_4_ * fVar23;
          fVar25 = auVar108._12_4_;
          auVar92._12_4_ = auVar76._12_4_ * fVar25;
          auVar57 = vfmsub231ps_fma(auVar92,auVar82,auVar84);
          auVar56 = vsubps_avx(auVar32,auVar60);
          fVar20 = auVar56._0_4_;
          auVar99._0_4_ = auVar84._0_4_ * fVar20;
          fVar22 = auVar56._4_4_;
          auVar99._4_4_ = auVar84._4_4_ * fVar22;
          fVar24 = auVar56._8_4_;
          auVar99._8_4_ = auVar84._8_4_ * fVar24;
          fVar26 = auVar56._12_4_;
          auVar99._12_4_ = auVar84._12_4_ * fVar26;
          auVar85._0_4_ = auVar32._0_4_ + auVar60._0_4_;
          auVar85._4_4_ = auVar32._4_4_ + auVar60._4_4_;
          auVar85._8_4_ = auVar32._8_4_ + auVar60._8_4_;
          auVar85._12_4_ = auVar32._12_4_ + auVar60._12_4_;
          auVar55 = vfmsub231ps_fma(auVar99,auVar108,auVar85);
          fVar107 = auVar82._0_4_;
          auVar86._0_4_ = fVar107 * auVar85._0_4_;
          fVar110 = auVar82._4_4_;
          auVar86._4_4_ = fVar110 * auVar85._4_4_;
          fVar111 = auVar82._8_4_;
          auVar86._8_4_ = fVar111 * auVar85._8_4_;
          fVar112 = auVar82._12_4_;
          auVar86._12_4_ = fVar112 * auVar85._12_4_;
          auVar76 = vfmsub231ps_fma(auVar86,auVar56,auVar76);
          auVar87._0_4_ = fVar8 * auVar76._0_4_;
          auVar87._4_4_ = fVar8 * auVar76._4_4_;
          auVar87._8_4_ = fVar8 * auVar76._8_4_;
          auVar87._12_4_ = fVar8 * auVar76._12_4_;
          auVar55 = vfmadd231ps_fma(auVar87,auVar106,auVar55);
          auVar76 = vfmadd231ps_fma(auVar55,auVar114,auVar57);
          auVar57 = vsubps_avx(auVar60,auVar65);
          auVar66._0_4_ = auVar60._0_4_ + auVar65._0_4_;
          auVar66._4_4_ = auVar60._4_4_ + auVar65._4_4_;
          auVar66._8_4_ = auVar60._8_4_ + auVar65._8_4_;
          auVar66._12_4_ = auVar60._12_4_ + auVar65._12_4_;
          auVar65 = vsubps_avx(auVar64,auVar73);
          auVar61._0_4_ = auVar64._0_4_ + auVar73._0_4_;
          auVar61._4_4_ = auVar64._4_4_ + auVar73._4_4_;
          auVar61._8_4_ = auVar64._8_4_ + auVar73._8_4_;
          auVar61._12_4_ = auVar64._12_4_ + auVar73._12_4_;
          auVar73 = vsubps_avx(auVar54,auVar74);
          auVar88._0_4_ = auVar54._0_4_ + auVar74._0_4_;
          auVar88._4_4_ = auVar54._4_4_ + auVar74._4_4_;
          auVar88._8_4_ = auVar54._8_4_ + auVar74._8_4_;
          auVar88._12_4_ = auVar54._12_4_ + auVar74._12_4_;
          auVar93._0_4_ = auVar73._0_4_ * auVar61._0_4_;
          auVar93._4_4_ = auVar73._4_4_ * auVar61._4_4_;
          auVar93._8_4_ = auVar73._8_4_ * auVar61._8_4_;
          auVar93._12_4_ = auVar73._12_4_ * auVar61._12_4_;
          auVar60 = vfmsub231ps_fma(auVar93,auVar65,auVar88);
          auVar89._0_4_ = auVar88._0_4_ * auVar57._0_4_;
          auVar89._4_4_ = auVar88._4_4_ * auVar57._4_4_;
          auVar89._8_4_ = auVar88._8_4_ * auVar57._8_4_;
          auVar89._12_4_ = auVar88._12_4_ * auVar57._12_4_;
          auVar55 = vfmsub231ps_fma(auVar89,auVar73,auVar66);
          auVar67._0_4_ = auVar65._0_4_ * auVar66._0_4_;
          auVar67._4_4_ = auVar65._4_4_ * auVar66._4_4_;
          auVar67._8_4_ = auVar65._8_4_ * auVar66._8_4_;
          auVar67._12_4_ = auVar65._12_4_ * auVar66._12_4_;
          auVar64 = vfmsub231ps_fma(auVar67,auVar57,auVar61);
          auVar68._0_4_ = fVar8 * auVar64._0_4_;
          auVar68._4_4_ = fVar8 * auVar64._4_4_;
          auVar68._8_4_ = fVar8 * auVar64._8_4_;
          auVar68._12_4_ = fVar8 * auVar64._12_4_;
          auVar55 = vfmadd231ps_fma(auVar68,auVar106,auVar55);
          auVar54 = vfmadd231ps_fma(auVar55,auVar114,auVar60);
          auVar105._0_4_ = auVar54._0_4_ + auVar75._0_4_ + auVar76._0_4_;
          auVar105._4_4_ = auVar54._4_4_ + auVar75._4_4_ + auVar76._4_4_;
          auVar105._8_4_ = auVar54._8_4_ + auVar75._8_4_ + auVar76._8_4_;
          auVar105._12_4_ = auVar54._12_4_ + auVar75._12_4_ + auVar76._12_4_;
          auVar62._8_4_ = 0x7fffffff;
          auVar62._0_8_ = 0x7fffffff7fffffff;
          auVar62._12_4_ = 0x7fffffff;
          auVar55 = vminps_avx(auVar75,auVar76);
          auVar60 = vminps_avx(auVar55,auVar54);
          auVar55 = vandps_avx(auVar105,auVar62);
          auVar100._0_4_ = auVar55._0_4_ * 1.1920929e-07;
          auVar100._4_4_ = auVar55._4_4_ * 1.1920929e-07;
          auVar100._8_4_ = auVar55._8_4_ * 1.1920929e-07;
          auVar100._12_4_ = auVar55._12_4_ * 1.1920929e-07;
          uVar31 = CONCAT44(auVar100._4_4_,auVar100._0_4_);
          auVar94._0_8_ = uVar31 ^ 0x8000000080000000;
          auVar94._8_4_ = -auVar100._8_4_;
          auVar94._12_4_ = -auVar100._12_4_;
          auVar60 = vcmpps_avx(auVar60,auVar94,5);
          auVar64 = vmaxps_avx(auVar75,auVar76);
          auVar64 = vmaxps_avx(auVar64,auVar54);
          auVar64 = vcmpps_avx(auVar64,auVar100,2);
          auVar60 = vorps_avx(auVar60,auVar64);
          if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar60[0xf] < '\0') {
            auVar69._0_4_ = auVar81._0_4_ * fVar107;
            auVar69._4_4_ = auVar81._4_4_ * fVar110;
            auVar69._8_4_ = auVar81._8_4_ * fVar111;
            auVar69._12_4_ = auVar81._12_4_ * fVar112;
            auVar90._0_4_ = fVar20 * auVar80._0_4_;
            auVar90._4_4_ = fVar22 * auVar80._4_4_;
            auVar90._8_4_ = fVar24 * auVar80._8_4_;
            auVar90._12_4_ = fVar26 * auVar80._12_4_;
            auVar74 = vfmsub213ps_fma(auVar80,auVar108,auVar69);
            auVar95._0_4_ = auVar65._0_4_ * fVar19;
            auVar95._4_4_ = auVar65._4_4_ * fVar21;
            auVar95._8_4_ = auVar65._8_4_ * fVar23;
            auVar95._12_4_ = auVar65._12_4_ * fVar25;
            auVar101._0_4_ = fVar20 * auVar73._0_4_;
            auVar101._4_4_ = fVar22 * auVar73._4_4_;
            auVar101._8_4_ = fVar24 * auVar73._8_4_;
            auVar101._12_4_ = fVar26 * auVar73._12_4_;
            auVar73 = vfmsub213ps_fma(auVar73,auVar82,auVar95);
            auVar64 = vandps_avx(auVar69,auVar62);
            auVar54 = vandps_avx(auVar95,auVar62);
            auVar64 = vcmpps_avx(auVar64,auVar54,1);
            local_898 = vblendvps_avx(auVar73,auVar74,auVar64);
            auVar96._0_4_ = auVar57._0_4_ * fVar107;
            auVar96._4_4_ = auVar57._4_4_ * fVar110;
            auVar96._8_4_ = auVar57._8_4_ * fVar111;
            auVar96._12_4_ = auVar57._12_4_ * fVar112;
            auVar73 = vfmsub213ps_fma(auVar57,auVar108,auVar101);
            auVar70._0_4_ = auVar79._0_4_ * fVar19;
            auVar70._4_4_ = auVar79._4_4_ * fVar21;
            auVar70._8_4_ = auVar79._8_4_ * fVar23;
            auVar70._12_4_ = auVar79._12_4_ * fVar25;
            auVar74 = vfmsub213ps_fma(auVar81,auVar56,auVar70);
            auVar64 = vandps_avx(auVar70,auVar62);
            auVar54 = vandps_avx(auVar101,auVar62);
            auVar64 = vcmpps_avx(auVar64,auVar54,1);
            local_888 = vblendvps_avx(auVar73,auVar74,auVar64);
            auVar73 = vfmsub213ps_fma(auVar79,auVar82,auVar90);
            auVar65 = vfmsub213ps_fma(auVar65,auVar56,auVar96);
            auVar64 = vandps_avx(auVar90,auVar62);
            auVar54 = vandps_avx(auVar96,auVar62);
            auVar64 = vcmpps_avx(auVar64,auVar54,1);
            local_878 = vblendvps_avx(auVar65,auVar73,auVar64);
            auVar77._0_4_ = local_878._0_4_ * fVar8;
            auVar77._4_4_ = local_878._4_4_ * fVar8;
            auVar77._8_4_ = local_878._8_4_ * fVar8;
            auVar77._12_4_ = local_878._12_4_ * fVar8;
            auVar64 = vfmadd213ps_fma(auVar106,local_888,auVar77);
            auVar64 = vfmadd213ps_fma(auVar114,local_898,auVar64);
            auVar91._0_4_ = auVar64._0_4_ + auVar64._0_4_;
            auVar91._4_4_ = auVar64._4_4_ + auVar64._4_4_;
            auVar91._8_4_ = auVar64._8_4_ + auVar64._8_4_;
            auVar91._12_4_ = auVar64._12_4_ + auVar64._12_4_;
            auVar78._0_4_ = local_878._0_4_ * fVar15;
            auVar78._4_4_ = local_878._4_4_ * fVar16;
            auVar78._8_4_ = local_878._8_4_ * fVar17;
            auVar78._12_4_ = local_878._12_4_ * fVar18;
            auVar64 = vfmadd213ps_fma(auVar30,local_888,auVar78);
            auVar32 = vfmadd213ps_fma(auVar32,local_898,auVar64);
            auVar64 = vrcpps_avx(auVar91);
            auVar104._8_4_ = 0x3f800000;
            auVar104._0_8_ = &DAT_3f8000003f800000;
            auVar104._12_4_ = 0x3f800000;
            auVar30 = vfnmadd213ps_fma(auVar64,auVar91,auVar104);
            auVar64 = vfmadd132ps_fma(auVar30,auVar64,auVar64);
            local_8a8._0_4_ = (auVar32._0_4_ + auVar32._0_4_) * auVar64._0_4_;
            local_8a8._4_4_ = (auVar32._4_4_ + auVar32._4_4_) * auVar64._4_4_;
            local_8a8._8_4_ = (auVar32._8_4_ + auVar32._8_4_) * auVar64._8_4_;
            local_8a8._12_4_ = (auVar32._12_4_ + auVar32._12_4_) * auVar64._12_4_;
            uVar43 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar97._4_4_ = uVar43;
            auVar97._0_4_ = uVar43;
            auVar97._8_4_ = uVar43;
            auVar97._12_4_ = uVar43;
            auVar64 = vcmpps_avx(auVar97,local_8a8,2);
            uVar43 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar102._4_4_ = uVar43;
            auVar102._0_4_ = uVar43;
            auVar102._8_4_ = uVar43;
            auVar102._12_4_ = uVar43;
            auVar32 = vcmpps_avx(local_8a8,auVar102,2);
            auVar64 = vandps_avx(auVar64,auVar32);
            auVar32 = auVar60 & auVar64;
            if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar32[0xf] < '\0') {
              auVar60 = vandps_avx(auVar60,auVar64);
              auVar64 = vcmpps_avx(auVar91,_DAT_01feba10,4);
              auVar32 = auVar64 & auVar60;
              if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar32[0xf] < '\0') {
                auVar60 = vandps_avx(auVar60,auVar64);
                pSVar12 = context->scene;
                auVar64 = vrcpps_avx(auVar105);
                auVar71._8_4_ = 0x3f800000;
                auVar71._0_8_ = &DAT_3f8000003f800000;
                auVar71._12_4_ = 0x3f800000;
                auVar32 = vfnmadd213ps_fma(auVar105,auVar64,auVar71);
                auVar64 = vfmadd132ps_fma(auVar32,auVar64,auVar64);
                auVar63._8_4_ = 0x219392ef;
                auVar63._0_8_ = 0x219392ef219392ef;
                auVar63._12_4_ = 0x219392ef;
                auVar55 = vcmpps_avx(auVar55,auVar63,5);
                auVar55 = vandps_avx(auVar64,auVar55);
                auVar58._0_4_ = auVar75._0_4_ * auVar55._0_4_;
                auVar58._4_4_ = auVar75._4_4_ * auVar55._4_4_;
                auVar58._8_4_ = auVar75._8_4_ * auVar55._8_4_;
                auVar58._12_4_ = auVar75._12_4_ * auVar55._12_4_;
                local_8c8 = vminps_avx(auVar58,auVar71);
                auVar59._0_4_ = auVar55._0_4_ * auVar76._0_4_;
                auVar59._4_4_ = auVar55._4_4_ * auVar76._4_4_;
                auVar59._8_4_ = auVar55._8_4_ * auVar76._8_4_;
                auVar59._12_4_ = auVar55._12_4_ * auVar76._12_4_;
                local_8b8 = vminps_avx(auVar59,auVar71);
                uVar43 = vmovmskps_avx(auVar60);
                uVar39 = CONCAT44((int)(uVar39 >> 0x20),uVar43);
                do {
                  uVar31 = 0;
                  for (uVar41 = uVar39; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000
                      ) {
                    uVar31 = uVar31 + 1;
                  }
                  uVar11 = *(uint *)(lVar40 + uVar47 + 0x120 + uVar31 * 4);
                  pGVar13 = (pSVar12->geometries).items[uVar11].ptr;
                  if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar39 = uVar39 ^ 1L << (uVar31 & 0x3f);
                    bVar52 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar52 = false;
                  }
                  else {
                    uVar41 = (ulong)(uint)((int)uVar31 * 4);
                    uVar43 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar9 = *(undefined4 *)(local_8c8 + uVar41);
                    local_838._4_4_ = uVar9;
                    local_838._0_4_ = uVar9;
                    local_838._8_4_ = uVar9;
                    local_838._12_4_ = uVar9;
                    uVar9 = *(undefined4 *)(local_8b8 + uVar41);
                    local_828._4_4_ = uVar9;
                    local_828._0_4_ = uVar9;
                    local_828._8_4_ = uVar9;
                    local_828._12_4_ = uVar9;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar41);
                    args.context = context->user;
                    local_808._4_4_ = uVar11;
                    local_808._0_4_ = uVar11;
                    local_808._8_4_ = uVar11;
                    local_808._12_4_ = uVar11;
                    uVar9 = *(undefined4 *)(lVar40 + uVar47 + 0x130 + uVar41);
                    local_818._4_4_ = uVar9;
                    local_818._0_4_ = uVar9;
                    local_818._8_4_ = uVar9;
                    local_818._12_4_ = uVar9;
                    uVar9 = *(undefined4 *)(local_898 + uVar41);
                    uVar10 = *(undefined4 *)(local_888 + uVar41);
                    local_858._4_4_ = uVar10;
                    local_858._0_4_ = uVar10;
                    local_858._8_4_ = uVar10;
                    local_858._12_4_ = uVar10;
                    uVar10 = *(undefined4 *)(local_878 + uVar41);
                    local_848._4_4_ = uVar10;
                    local_848._0_4_ = uVar10;
                    local_848._8_4_ = uVar10;
                    local_848._12_4_ = uVar10;
                    local_868[0] = (RTCHitN)(char)uVar9;
                    local_868[1] = (RTCHitN)(char)((uint)uVar9 >> 8);
                    local_868[2] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                    local_868[3] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                    local_868[4] = (RTCHitN)(char)uVar9;
                    local_868[5] = (RTCHitN)(char)((uint)uVar9 >> 8);
                    local_868[6] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                    local_868[7] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                    local_868[8] = (RTCHitN)(char)uVar9;
                    local_868[9] = (RTCHitN)(char)((uint)uVar9 >> 8);
                    local_868[10] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                    local_868[0xb] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                    local_868[0xc] = (RTCHitN)(char)uVar9;
                    local_868[0xd] = (RTCHitN)(char)((uint)uVar9 >> 8);
                    local_868[0xe] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                    local_868[0xf] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                    vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                    uStack_7f4 = (args.context)->instID[0];
                    local_7f8 = uStack_7f4;
                    uStack_7f0 = uStack_7f4;
                    uStack_7ec = uStack_7f4;
                    uStack_7e8 = (args.context)->instPrimID[0];
                    uStack_7e4 = uStack_7e8;
                    uStack_7e0 = uStack_7e8;
                    uStack_7dc = uStack_7e8;
                    local_ab8 = *local_aa8;
                    uStack_ab0 = local_aa8[1];
                    args.valid = (int *)&local_ab8;
                    args.geometryUserPtr = pGVar13->userPtr;
                    args.hit = local_868;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar13->occlusionFilterN)(&args);
                    }
                    auVar37._8_8_ = uStack_ab0;
                    auVar37._0_8_ = local_ab8;
                    if (auVar37 == (undefined1  [16])0x0) {
                      auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar55 = auVar55 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var14)(&args);
                      }
                      auVar38._8_8_ = uStack_ab0;
                      auVar38._0_8_ = local_ab8;
                      auVar60 = vpcmpeqd_avx((undefined1  [16])0x0,auVar38);
                      auVar55 = auVar60 ^ _DAT_01febe20;
                      auVar72._8_4_ = 0xff800000;
                      auVar72._0_8_ = 0xff800000ff800000;
                      auVar72._12_4_ = 0xff800000;
                      auVar60 = vblendvps_avx(auVar72,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar60);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar60;
                    }
                    auVar55 = vpslld_avx(auVar55,0x1f);
                    bVar35 = (auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar36 = (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar34 = (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar33 = -1 < auVar55[0xf];
                    bVar52 = ((bVar35 && bVar36) && bVar34) && bVar33;
                    if (((bVar35 && bVar36) && bVar34) && bVar33) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar43;
                      uVar39 = uVar39 ^ 1L << (uVar31 & 0x3f);
                    }
                  }
                  if (!bVar52) {
                    if (bVar51) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar49 = 1;
                    }
                    goto LAB_0056f9d4;
                  }
                } while (uVar39 != 0);
                uVar39 = 0;
              }
            }
          }
          local_a98 = local_a98 + 1;
          bVar51 = local_a98 < local_aa0;
        } while (local_a98 != local_aa0);
      }
    }
LAB_0056f9d4:
  } while ((uVar49 & 3) == 0);
  return local_a90 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }